

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerGLSL::optimize_read_modify_write
          (CompilerGLSL *this,SPIRType *type,string *lhs,string *rhs)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char bop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expr;
  char local_49;
  string local_48;
  
  if ((lhs->_M_string_length + 3 <= rhs->_M_string_length) &&
     ((type->vecsize < 2 || (type->columns < 2)))) {
    lVar5 = ::std::__cxx11::string::find((char *)rhs,(ulong)(lhs->_M_dataplus)._M_p,0);
    if (lVar5 != 0) {
      return false;
    }
    lVar5 = ::std::__cxx11::string::find_first_of((char *)rhs,0x405555,lhs->_M_string_length + 1);
    if ((lVar5 == lhs->_M_string_length + 1) &&
       (pcVar2 = (rhs->_M_dataplus)._M_p, pcVar2[lVar5 + 1] == ' ')) {
      cVar1 = pcVar2[lVar5];
      local_49 = cVar1;
      ::std::__cxx11::string::substr((ulong)&local_48,(ulong)rhs);
      bVar3 = needs_enclose_expression(&local_48);
      if (!bVar3) {
        if (((cVar1 == '-') || (cVar1 == '+')) &&
           ((iVar4 = ::std::__cxx11::string::compare((char *)&local_48), iVar4 == 0 ||
            (((iVar4 = ::std::__cxx11::string::compare((char *)&local_48), iVar4 == 0 ||
              (iVar4 = ::std::__cxx11::string::compare((char *)&local_48), iVar4 == 0)) ||
             (iVar4 = ::std::__cxx11::string::compare((char *)&local_48), iVar4 == 0)))))) {
          statement<std::__cxx11::string_const&,char&,char&,char_const(&)[2]>
                    (this,lhs,&local_49,&local_49,(char (*) [2])0x405f81);
        }
        else {
          statement<std::__cxx11::string_const&,char_const(&)[2],char&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                    (this,lhs,(char (*) [2])0x3c91f1,&local_49,(char (*) [3])0x3fb086,&local_48,
                     (char (*) [2])0x405f81);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      return !bVar3;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::optimize_read_modify_write(const SPIRType &type, const string &lhs, const string &rhs)
{
	// Do this with strings because we have a very clear pattern we can check for and it avoids
	// adding lots of special cases to the code emission.
	if (rhs.size() < lhs.size() + 3)
		return false;

	// Do not optimize matrices. They are a bit awkward to reason about in general
	// (in which order does operation happen?), and it does not work on MSL anyways.
	if (type.vecsize > 1 && type.columns > 1)
		return false;

	auto index = rhs.find(lhs);
	if (index != 0)
		return false;

	// TODO: Shift operators, but it's not important for now.
	auto op = rhs.find_first_of("+-/*%|&^", lhs.size() + 1);
	if (op != lhs.size() + 1)
		return false;

	// Check that the op is followed by space. This excludes && and ||.
	if (rhs[op + 1] != ' ')
		return false;

	char bop = rhs[op];
	auto expr = rhs.substr(lhs.size() + 3);

	// Avoids false positives where we get a = a * b + c.
	// Normally, these expressions are always enclosed, but unexpected code paths may end up hitting this.
	if (needs_enclose_expression(expr))
		return false;

	// Try to find increments and decrements. Makes it look neater as += 1, -= 1 is fairly rare to see in real code.
	// Find some common patterns which are equivalent.
	if ((bop == '+' || bop == '-') && (expr == "1" || expr == "uint(1)" || expr == "1u" || expr == "int(1u)"))
		statement(lhs, bop, bop, ";");
	else
		statement(lhs, " ", bop, "= ", expr, ";");
	return true;
}